

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall kratos::StmtBlock::add_stmt(StmtBlock *this,shared_ptr<kratos::Stmt> *stmt)

{
  int iVar1;
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  _Var2;
  StmtException *pSVar3;
  element_type *peVar4;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  initializer_list<kratos::IRNode_*> __l_02;
  initializer_list<kratos::IRNode_*> __l_03;
  StmtBlock *local_88;
  element_type *local_80;
  undefined1 local_78 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt;
  string local_50;
  allocator_type local_29;
  
  peVar4 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    pSVar3 = (StmtException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unable to add nullptr (None) to code block","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_78;
    local_78 = (undefined1  [8])this;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
               &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,__l,(allocator_type *)&local_88);
    StmtException::StmtException
              (pSVar3,&local_50,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
               &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __cxa_throw(pSVar3,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (peVar4->type_ == Block) {
    pSVar3 = (StmtException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"cannot add statement block to another statement block","");
    assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_78;
    local_78 = (undefined1  [8])this;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
               &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,__l_00,(allocator_type *)&local_88);
    StmtException::StmtException
              (pSVar3,&local_50,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
               &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __cxa_throw(pSVar3,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<kratos::Stmt>const>>
                    ((this->stmts_).
                     super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->stmts_).
                     super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,stmt);
  if (_Var2._M_current !=
      (this->stmts_).
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar3 = (StmtException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Cannot add the same block to the block list","");
    assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)local_78;
    local_78 = (undefined1  [8])this;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
               &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,__l_01,(allocator_type *)&local_88);
    StmtException::StmtException
              (pSVar3,&local_50,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
               &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __cxa_throw(pSVar3,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar4 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar4->type_ == Assign) {
    Stmt::as<kratos::AssignStmt>((Stmt *)local_78);
    iVar1 = *(int *)&((IRNode *)((long)local_78 + 0xd0))->_vptr_IRNode;
    if (iVar1 != 2) {
      local_88 = this;
      if (iVar1 == 1 && this->block_type_ == Combinational) {
        pSVar3 = (StmtException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"cannot add blocking assignment to a sequential block","");
        local_80 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        __l_02._M_len = 2;
        __l_02._M_array = (iterator)&local_88;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                   &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,__l_02,&local_29);
        StmtException::StmtException
                  (pSVar3,&local_50,
                   (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                   &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        __cxa_throw(pSVar3,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      if (iVar1 == 0 && this->block_type_ == Sequential) {
        pSVar3 = (StmtException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"cannot add non-blocking assignment to a combinational block"
                   ,"");
        local_80 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        __l_03._M_len = 2;
        __l_03._M_array = (iterator)&local_88;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                   &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,__l_03,&local_29);
        StmtException::StmtException
                  (pSVar3,&local_50,
                   (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                   &assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        __cxa_throw(pSVar3,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    peVar4 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  (*(peVar4->super_IRNode)._vptr_IRNode[7])(peVar4,this);
  std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
  emplace_back<std::shared_ptr<kratos::Stmt>const&>
            ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>> *)
             &this->stmts_,stmt);
  return;
}

Assistant:

void StmtBlock::add_stmt(const std::shared_ptr<Stmt> &stmt) {
    if (!stmt) throw StmtException("Unable to add nullptr (None) to code block", {this});
    // it cannot add another block stmt
    if (stmt->type() == StatementType::Block) {
        throw StmtException("cannot add statement block to another statement block",
                            {this, stmt.get()});
    }
    if (std::find(stmts_.begin(), stmts_.end(), stmt) != stmts_.end()) {
        throw StmtException("Cannot add the same block to the block list", {this, stmt.get()});
    }
    // if it is an assign statement, check the assignment as well
    if (stmt->type() == StatementType::Assign) {
        auto assign_stmt = stmt->as<AssignStmt>();
        if (assign_stmt->assign_type() == AssignmentType::Undefined) {
            // let the passes to figure this out
        } else if (assign_stmt->assign_type() == AssignmentType::NonBlocking &&
                   block_type_ == StatementBlockType::Combinational) {
            throw StmtException("cannot add blocking assignment to a sequential block",
                                {this, stmt.get()});
        } else if (assign_stmt->assign_type() == AssignmentType::Blocking &&
                   block_type_ == StatementBlockType::Sequential) {
            throw StmtException("cannot add non-blocking assignment to a combinational block",
                                {this, stmt.get()});
        }
    }
    stmt->set_parent(this);
    stmts_.emplace_back(stmt);
}